

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

int parse_tdp_token_chain(simple_token *chain)

{
  simple_token *psVar1;
  void *yyp;
  simple_token *yyminor;
  int iVar2;
  simple_token *result;
  
  yyp = TDPParseAlloc(malloc);
  yyminor = chain->next;
  result = (simple_token *)0x0;
  fputc(10,_stderr);
  TDPParseTrace((FILE *)_stderr,"parser >>");
  while (yyminor != (simple_token *)0x0) {
    psVar1 = yyminor->next;
    yyminor->next = (simple_token *)0x0;
    yyminor->tail = yyminor;
    if (psVar1 != (simple_token *)0x0) {
      psVar1->prev = (simple_token *)0x0;
    }
    TDPParse(yyp,(uint)yyminor->type,yyminor,&result);
    yyminor = psVar1;
  }
  iVar2 = 0;
  TDPParse(yyp,0,(simple_token *)0x0,&result);
  TDPParseFree(yyp,free);
  if (result == (simple_token *)0x0) {
    iVar2 = -1;
  }
  else {
    chain->next = (simple_token *)0x0;
    chain->child = result;
  }
  return iVar2;
}

Assistant:

int parse_tdp_token_chain(simple_token * chain) {

	// Parser
	void * pParser = TDPParseAlloc (malloc);
	simple_token * walker = chain->next;
	simple_token * remainder;

	simple_token * result = NULL;

#ifndef NDEBUG
	fprintf(stderr, "\n");
	TDPParseTrace(stderr, "parser >>");
#endif

	while (walker != NULL) {
		remainder = walker->next;

		// Snip token from remainder
		walker->next = NULL;
		walker->tail = walker;

		if (remainder) {
			remainder->prev = NULL;
		}

		TDPParse(pParser, walker->type, walker, &result);

		walker = remainder;
	}

	// Signal that we're done
	TDPParse(pParser, 0, NULL, &result);

	TDPParseFree(pParser, free);

	if (result) {
		// Success
		chain->next = NULL;
		chain->child = result;
		return 0;
	} else {
		// Failed
		return -1;
	}
}